

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtPolyhedralConvexShape.cpp
# Opt level: O3

bool __thiscall
cbtPolyhedralConvexShape::initializePolyhedralFeatures
          (cbtPolyhedralConvexShape *this,int shiftVerticesByMargin)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  cbtVector3 *ptr;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  cbtConvexPolyhedron *pcVar11;
  cbtVector3 *pcVar12;
  int *piVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  int *ptr_00;
  int iVar20;
  Edge *pEVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  undefined1 auVar27 [16];
  float fVar26;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  cbtAlignedObjectArray<cbtVector3> shiftedPlaneEquations;
  cbtAlignedObjectArray<cbtVector3> orgVertices;
  cbtAlignedObjectArray<cbtVector3> tmpVertices;
  cbtAlignedObjectArray<cbtVector3> planeEquations;
  cbtConvexHullComputer conv;
  cbtFace local_150;
  cbtAlignedObjectArray<cbtVector3> local_120;
  long local_100;
  float local_f4;
  cbtPolyhedralConvexShape *local_f0;
  cbtAlignedObjectArray<cbtVector3> local_e8;
  undefined1 local_c8 [16];
  float local_b8;
  float fStack_b4;
  float local_b0;
  cbtConvexHullComputer local_90;
  
  if (this->m_polyhedron != (cbtConvexPolyhedron *)0x0) {
    (**this->m_polyhedron->_vptr_cbtConvexPolyhedron)();
    cbtAlignedFreeInternal(this->m_polyhedron);
  }
  pcVar11 = (cbtConvexPolyhedron *)cbtAlignedAllocInternal(0xb0,0x10);
  cbtConvexPolyhedron::cbtConvexPolyhedron(pcVar11);
  this->m_polyhedron = pcVar11;
  uVar18 = 0;
  local_120.m_ownsMemory = true;
  local_120.m_data = (cbtVector3 *)0x0;
  local_120.m_size = 0;
  local_120.m_capacity = 0;
  local_f0 = this;
  while( true ) {
    iVar9 = (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
              _vptr_cbtCollisionShape[0x19])(this);
    iVar22 = local_120.m_size;
    if (iVar9 <= (int)uVar18) break;
    uVar10 = local_120.m_size;
    if (local_120.m_size == local_120.m_capacity) {
      uVar19 = local_120.m_size * 2;
      if (local_120.m_size == 0) {
        uVar19 = 1;
      }
      if (local_120.m_size < (int)uVar19) {
        if (uVar19 == 0) {
          pcVar12 = (cbtVector3 *)0x0;
        }
        else {
          pcVar12 = (cbtVector3 *)cbtAlignedAllocInternal((long)(int)uVar19 << 4,0x10);
          uVar10 = local_120.m_size;
        }
        if ((int)uVar10 < 1) {
          if (local_120.m_data != (cbtVector3 *)0x0) goto LAB_008d185a;
        }
        else {
          lVar17 = 0;
          do {
            puVar1 = (undefined8 *)((long)(local_120.m_data)->m_floats + lVar17);
            uVar7 = puVar1[1];
            puVar2 = (undefined8 *)((long)pcVar12->m_floats + lVar17);
            *puVar2 = *puVar1;
            puVar2[1] = uVar7;
            lVar17 = lVar17 + 0x10;
          } while ((ulong)uVar10 << 4 != lVar17);
LAB_008d185a:
          if (local_120.m_ownsMemory == true) {
            cbtAlignedFreeInternal(local_120.m_data);
            uVar10 = local_120.m_size;
          }
        }
        local_120.m_ownsMemory = true;
        local_120._4_8_ = (ulong)uVar19 << 0x20;
        local_120.m_data = pcVar12;
      }
    }
    this = local_f0;
    local_120.m_size = uVar10 + 1;
    (*(local_f0->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
      _vptr_cbtCollisionShape[0x1c])(local_f0,uVar18,local_120.m_data + iVar22);
    uVar18 = (ulong)((int)uVar18 + 1);
  }
  local_90.vertices.m_ownsMemory = true;
  local_90.vertices.m_data = (cbtVector3 *)0x0;
  local_90.vertices.m_size = 0;
  local_90.vertices.m_capacity = 0;
  local_90.edges.m_ownsMemory = true;
  local_90.edges.m_data = (Edge *)0x0;
  local_90.edges.m_size = 0;
  local_90.edges.m_capacity = 0;
  local_90.faces.m_ownsMemory = true;
  local_90.faces.m_data = (int *)0x0;
  local_90.faces.m_size = 0;
  local_90.faces.m_capacity = 0;
  if (shiftVerticesByMargin == 0) {
    auVar28._0_4_ =
         cbtConvexHullComputer::compute
                   (&local_90,local_120.m_data,false,0x10,local_120.m_size,0.0,0.0);
    auVar28._4_60_ = extraout_var_00;
  }
  else {
    local_b0 = (float)CONCAT31(local_b0._1_3_,1);
    local_b8 = 0.0;
    fStack_b4 = 0.0;
    local_c8._4_8_ = 0;
    cbtGeometryUtil::getPlaneEquationsFromVertices
              (&local_120,(cbtAlignedObjectArray<cbtVector3> *)local_c8);
    local_150.m_indices.m_ownsMemory = true;
    local_150.m_indices.m_data = (int *)0x0;
    local_150.m_indices.m_size = 0;
    local_150.m_indices.m_capacity = 0;
    if (0 < (int)local_c8._4_4_) {
      lVar17 = 0;
      do {
        lVar16 = CONCAT44(fStack_b4,local_b8);
        lVar15 = lVar17 * 0x10;
        local_e8._0_4_ = SUB84(*(undefined8 *)(lVar16 + lVar15),0);
        local_e8.m_size = (int)((ulong)*(undefined8 *)(lVar16 + lVar15) >> 0x20);
        local_e8.m_capacity = *(int *)(lVar16 + 8 + lVar15);
        fVar25 = *(float *)(lVar16 + 0xc + lVar15);
        local_100 = CONCAT44(local_100._4_4_,fVar25);
        (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
          _vptr_cbtCollisionShape[0xc])(this);
        uVar10 = local_150.m_indices.m_size;
        local_f4 = fVar25;
        if (local_150.m_indices.m_size == local_150.m_indices.m_capacity) {
          iVar22 = local_150.m_indices.m_size * 2;
          if (local_150.m_indices.m_size == 0) {
            iVar22 = 1;
          }
          if (local_150.m_indices.m_size < iVar22) {
            if (iVar22 == 0) {
              piVar13 = (int *)0x0;
            }
            else {
              piVar13 = (int *)cbtAlignedAllocInternal((long)iVar22 << 4,0x10);
            }
            if (0 < local_150.m_indices.m_size) {
              lVar16 = 0;
              do {
                uVar7 = ((undefined8 *)((long)local_150.m_indices.m_data + lVar16))[1];
                *(undefined8 *)((long)piVar13 + lVar16) =
                     *(undefined8 *)((long)local_150.m_indices.m_data + lVar16);
                ((undefined8 *)((long)piVar13 + lVar16))[1] = uVar7;
                lVar16 = lVar16 + 0x10;
              } while ((ulong)(uint)local_150.m_indices.m_size << 4 != lVar16);
            }
            if ((local_150.m_indices.m_data != (int *)0x0) &&
               (local_150.m_indices.m_ownsMemory == true)) {
              cbtAlignedFreeInternal(local_150.m_indices.m_data);
            }
            local_150.m_indices.m_ownsMemory = true;
            local_150.m_indices.m_capacity = iVar22;
            uVar10 = local_150.m_indices.m_size;
            local_150.m_indices.m_data = piVar13;
          }
        }
        lVar16 = (long)(int)uVar10;
        lVar17 = lVar17 + 1;
        local_150.m_indices.m_data[lVar16 * 4 + 2] = local_e8.m_capacity;
        *(ulong *)(local_150.m_indices.m_data + lVar16 * 4) =
             CONCAT44(local_e8.m_size,local_e8._0_4_);
        local_150.m_indices.m_data[lVar16 * 4 + 3] = (int)((float)local_100 - local_f4);
        local_150.m_indices.m_size = local_150.m_indices.m_size + 1;
      } while (lVar17 < (int)local_c8._4_4_);
    }
    local_e8.m_ownsMemory = true;
    local_e8.m_data = (cbtVector3 *)0x0;
    local_e8.m_size = 0;
    local_e8.m_capacity = 0;
    cbtGeometryUtil::getVerticesFromPlaneEquations
              ((cbtAlignedObjectArray<cbtVector3> *)&local_150,&local_e8);
    auVar28._0_4_ =
         cbtConvexHullComputer::compute
                   (&local_90,local_e8.m_data,false,0x10,local_e8.m_size,0.0,0.0);
    auVar28._4_60_ = extraout_var;
    cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&local_e8);
    cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray
              ((cbtAlignedObjectArray<cbtVector3> *)&local_150);
    cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray
              ((cbtAlignedObjectArray<cbtVector3> *)local_c8);
  }
  pcVar11 = this->m_polyhedron;
  iVar22 = local_90.vertices.m_size;
  uVar18 = local_90.vertices._4_8_ & 0xffffffff;
  uVar10 = (pcVar11->m_vertices).m_size;
  if (((int)uVar10 < local_90.vertices.m_size) &&
     ((pcVar11->m_vertices).m_capacity < local_90.vertices.m_size)) {
    if (local_90.vertices.m_size == 0) {
      pcVar12 = (cbtVector3 *)0x0;
    }
    else {
      pcVar12 = (cbtVector3 *)cbtAlignedAllocInternal((long)local_90.vertices.m_size << 4,0x10);
      uVar10 = (pcVar11->m_vertices).m_size;
    }
    if (0 < (int)uVar10) {
      lVar17 = 0;
      do {
        auVar24 = *(undefined1 (*) [16])((long)((pcVar11->m_vertices).m_data)->m_floats + lVar17);
        auVar28 = ZEXT1664(auVar24);
        *(undefined1 (*) [16])((long)pcVar12->m_floats + lVar17) = auVar24;
        lVar17 = lVar17 + 0x10;
      } while ((ulong)uVar10 << 4 != lVar17);
    }
    ptr = (pcVar11->m_vertices).m_data;
    if ((ptr != (cbtVector3 *)0x0) && ((pcVar11->m_vertices).m_ownsMemory == true)) {
      cbtAlignedFreeInternal(ptr);
    }
    (pcVar11->m_vertices).m_ownsMemory = true;
    (pcVar11->m_vertices).m_data = pcVar12;
    (pcVar11->m_vertices).m_capacity = iVar22;
  }
  (pcVar11->m_vertices).m_size = iVar22;
  if (0 < iVar22) {
    lVar17 = 0;
    do {
      auVar24 = *(undefined1 (*) [16])((long)(local_90.vertices.m_data)->m_floats + lVar17);
      auVar28 = ZEXT1664(auVar24);
      *(undefined1 (*) [16])((long)((this->m_polyhedron->m_vertices).m_data)->m_floats + lVar17) =
           auVar24;
      lVar17 = lVar17 + 0x10;
    } while (uVar18 << 4 != lVar17);
  }
  if (0 < local_90.faces.m_size) {
    lVar17 = 0;
    do {
      auVar24 = auVar28._0_16_;
      local_150.m_indices.m_ownsMemory = true;
      local_150.m_indices.m_data = (int *)0x0;
      local_150.m_indices.m_size = 0;
      local_150.m_indices.m_capacity = 0;
      pEVar21 = local_90.edges.m_data + local_90.faces.m_data[lVar17];
      iVar22 = pEVar21[pEVar21->reverse].targetVertex;
      local_100 = lVar17;
      piVar13 = (int *)cbtAlignedAllocInternal(4,0x10);
      if ((long)local_150.m_indices.m_size < 1) {
        if (local_150.m_indices.m_data != (int *)0x0) goto LAB_008d1c1a;
      }
      else {
        lVar17 = 0;
        do {
          piVar13[lVar17] = local_150.m_indices.m_data[lVar17];
          lVar17 = lVar17 + 1;
        } while (local_150.m_indices.m_size != lVar17);
LAB_008d1c1a:
        if (local_150.m_indices.m_ownsMemory == true) {
          cbtAlignedFreeInternal(local_150.m_indices.m_data);
        }
      }
      lVar17 = (long)local_150.m_indices.m_size;
      piVar13[lVar17] = iVar22;
      uVar10 = local_150.m_indices.m_size + 1;
      local_150.m_indices.m_capacity = 1;
      local_150.m_indices.m_size = uVar10;
      local_150.m_indices.m_data = piVar13;
      if (pEVar21->targetVertex != iVar22) {
        uVar19 = 0;
        ptr_00 = piVar13;
        iVar9 = pEVar21->targetVertex;
        iVar20 = iVar22;
        do {
          iVar14 = iVar9;
          local_150.m_indices.m_ownsMemory = true;
          uVar8 = 2;
          if ((int)uVar19 < 2) {
            auVar24._8_8_ = 0;
            auVar24._0_8_ = *(ulong *)local_90.vertices.m_data[iVar14].m_floats;
            auVar31._8_8_ = 0;
            auVar31._0_8_ = *(ulong *)local_90.vertices.m_data[iVar20].m_floats;
            fVar26 = local_90.vertices.m_data[iVar14].m_floats[2] -
                     local_90.vertices.m_data[iVar20].m_floats[2];
            auVar23 = vsubps_avx(auVar24,auVar31);
            fVar25 = auVar23._0_4_;
            auVar32._0_4_ = fVar25 * fVar25;
            fVar3 = auVar23._4_4_;
            auVar32._4_4_ = fVar3 * fVar3;
            fVar4 = auVar23._8_4_;
            auVar32._8_4_ = fVar4 * fVar4;
            fVar5 = auVar23._12_4_;
            auVar32._12_4_ = fVar5 * fVar5;
            auVar24 = vmovshdup_avx(auVar32);
            auVar24 = vfmadd231ss_fma(auVar24,auVar23,auVar23);
            auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
            auVar24 = vsqrtss_avx(auVar24,auVar24);
            fVar30 = 1.0 / auVar24._0_4_;
            auVar23._0_4_ = fVar25 * fVar30;
            auVar23._4_4_ = fVar3 * fVar30;
            auVar23._8_4_ = fVar4 * fVar30;
            auVar23._12_4_ = fVar5 * fVar30;
            auVar24 = vinsertps_avx(auVar23,ZEXT416((uint)(fVar26 * fVar30)),0x28);
            *(undefined1 (*) [16])(local_c8 + (ulong)uVar19 * 0x10) = auVar24;
            uVar8 = uVar19 + 1;
          }
          uVar19 = uVar8;
          piVar13 = ptr_00;
          if (uVar10 == local_150.m_indices.m_capacity) {
            iVar9 = uVar10 * 2;
            if (uVar10 == 0) {
              iVar9 = 1;
            }
            if ((int)uVar10 < iVar9) {
              if (iVar9 == 0) {
                piVar13 = (int *)0x0;
              }
              else {
                piVar13 = (int *)cbtAlignedAllocInternal((long)iVar9 << 2,0x10);
                ptr_00 = local_150.m_indices.m_data;
                uVar10 = local_150.m_indices.m_size;
              }
              if ((int)uVar10 < 1) {
                if (ptr_00 != (int *)0x0) goto LAB_008d1d4a;
              }
              else {
                uVar18 = 0;
                do {
                  piVar13[uVar18] = ptr_00[uVar18];
                  uVar18 = uVar18 + 1;
                } while (uVar10 != uVar18);
LAB_008d1d4a:
                if (local_150.m_indices.m_ownsMemory == true) {
                  cbtAlignedFreeInternal(ptr_00);
                }
                uVar10 = local_150.m_indices.m_size;
              }
              local_150.m_indices.m_capacity = iVar9;
              local_150.m_indices.m_data = piVar13;
            }
          }
          piVar13[(int)uVar10] = iVar14;
          uVar10 = local_150.m_indices.m_size + 1;
          local_150.m_indices.m_size = uVar10;
          pEVar21 = pEVar21 + pEVar21->reverse + pEVar21[pEVar21->reverse].next;
          ptr_00 = piVar13;
          iVar9 = pEVar21->targetVertex;
          iVar20 = iVar14;
        } while (pEVar21->targetVertex != iVar22);
        auVar24 = ZEXT416((uint)local_c8._0_4_);
        this = local_f0;
      }
      local_150.m_indices.m_ownsMemory = true;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_c8._4_8_;
      auVar35._4_4_ = local_b0;
      auVar35._0_4_ = fStack_b4;
      auVar35._8_8_ = 0;
      auVar23 = vpermt2ps_avx512vl(auVar33,_DAT_009d86b0,auVar24);
      auVar36._0_4_ = fStack_b4 * auVar23._0_4_;
      auVar36._4_4_ = local_b0 * auVar23._4_4_;
      auVar36._8_4_ = auVar23._8_4_ * 0.0;
      auVar36._12_4_ = auVar23._12_4_ * 0.0;
      auVar32 = vfmsub231ss_fma(ZEXT416((uint)(local_b8 * (float)local_c8._4_8_)),auVar24,auVar35);
      auVar24 = vpermt2ps_avx512vl(auVar35,_DAT_009d86b0,ZEXT416((uint)local_b8));
      auVar31 = vfmsub213ps_fma(auVar24,auVar33,auVar36);
      auVar24 = SUB6416(ZEXT464(0x7149f2ca),0);
      fVar25 = auVar31._0_4_;
      auVar27._0_4_ = fVar25 * fVar25;
      fVar3 = auVar31._4_4_;
      auVar27._4_4_ = fVar3 * fVar3;
      fVar4 = auVar31._8_4_;
      auVar27._8_4_ = fVar4 * fVar4;
      fVar5 = auVar31._12_4_;
      auVar27._12_4_ = fVar5 * fVar5;
      auVar23 = vmovshdup_avx(auVar27);
      auVar23 = vfmadd231ss_fma(auVar23,auVar31,auVar31);
      auVar23 = vfmadd231ss_fma(auVar23,auVar32,auVar32);
      auVar23 = vsqrtss_avx(auVar23,auVar23);
      fVar26 = 1.0 / auVar23._0_4_;
      local_150.m_plane[2] = auVar32._0_4_ * fVar26;
      auVar28 = ZEXT464((uint)local_150.m_plane[2]);
      auVar29._0_4_ = fVar25 * fVar26;
      auVar29._4_4_ = fVar3 * fVar26;
      auVar29._8_4_ = fVar4 * fVar26;
      auVar29._12_4_ = fVar5 * fVar26;
      if (0 < (int)uVar10) {
        auVar34 = ZEXT464(0x7149f2ca);
        pcVar12 = (this->m_polyhedron->m_vertices).m_data;
        auVar23 = vmovshdup_avx(auVar29);
        uVar18 = 0;
        do {
          iVar22 = piVar13[uVar18];
          uVar18 = uVar18 + 1;
          auVar24 = vfmadd231ss_fma(ZEXT416((uint)(auVar23._0_4_ * pcVar12[iVar22].m_floats[1])),
                                    auVar29,ZEXT416((uint)pcVar12[iVar22].m_floats[0]));
          auVar24 = vfmadd231ss_fma(auVar24,ZEXT416((uint)local_150.m_plane[2]),
                                    ZEXT416((uint)pcVar12[iVar22].m_floats[2]));
          auVar24 = vminss_avx(auVar24,auVar34._0_16_);
          auVar34 = ZEXT1664(auVar24);
        } while (uVar10 != uVar18);
      }
      auVar6._8_4_ = 0x80000000;
      auVar6._0_8_ = 0x8000000080000000;
      auVar6._12_4_ = 0x80000000;
      auVar24 = vxorps_avx512vl(auVar24,auVar6);
      local_150.m_plane._0_8_ = vmovlps_avx(auVar29);
      local_150.m_plane[3] = auVar24._0_4_;
      cbtAlignedObjectArray<cbtFace>::push_back(&this->m_polyhedron->m_faces,&local_150);
      cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&local_150.m_indices);
      lVar17 = local_100 + 1;
    } while (lVar17 < local_90.faces.m_size);
  }
  cbtConvexPolyhedron::initialize(this->m_polyhedron);
  cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&local_90.faces);
  cbtAlignedObjectArray<cbtConvexHullComputer::Edge>::~cbtAlignedObjectArray(&local_90.edges);
  cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&local_90.vertices);
  cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&local_120);
  return true;
}

Assistant:

bool cbtPolyhedralConvexShape::initializePolyhedralFeatures(int shiftVerticesByMargin)
{
	if (m_polyhedron)
	{
		m_polyhedron->~cbtConvexPolyhedron();
		cbtAlignedFree(m_polyhedron);
	}

	void* mem = cbtAlignedAlloc(sizeof(cbtConvexPolyhedron), 16);
	m_polyhedron = new (mem) cbtConvexPolyhedron;

	cbtAlignedObjectArray<cbtVector3> orgVertices;

	for (int i = 0; i < getNumVertices(); i++)
	{
		cbtVector3& newVertex = orgVertices.expand();
		getVertex(i, newVertex);
	}

	cbtConvexHullComputer conv;

	if (shiftVerticesByMargin)
	{
		cbtAlignedObjectArray<cbtVector3> planeEquations;
		cbtGeometryUtil::getPlaneEquationsFromVertices(orgVertices, planeEquations);

		cbtAlignedObjectArray<cbtVector3> shiftedPlaneEquations;
		for (int p = 0; p < planeEquations.size(); p++)
		{
			cbtVector3 plane = planeEquations[p];
			//	   cbtScalar margin = getMargin();
			plane[3] -= getMargin();
			shiftedPlaneEquations.push_back(plane);
		}

		cbtAlignedObjectArray<cbtVector3> tmpVertices;

		cbtGeometryUtil::getVerticesFromPlaneEquations(shiftedPlaneEquations, tmpVertices);

		conv.compute(&tmpVertices[0].getX(), sizeof(cbtVector3), tmpVertices.size(), 0.f, 0.f);
	}
	else
	{
		conv.compute(&orgVertices[0].getX(), sizeof(cbtVector3), orgVertices.size(), 0.f, 0.f);
	}

#ifndef BT_RECONSTRUCT_FACES

	int numVertices = conv.vertices.size();
	m_polyhedron->m_vertices.resize(numVertices);
	for (int p = 0; p < numVertices; p++)
	{
		m_polyhedron->m_vertices[p] = conv.vertices[p];
	}

	int v0, v1;
	for (int j = 0; j < conv.faces.size(); j++)
	{
		cbtVector3 edges[3];
		int numEdges = 0;
		cbtFace combinedFace;
		const cbtConvexHullComputer::Edge* edge = &conv.edges[conv.faces[j]];
		v0 = edge->getSourceVertex();
		int prevVertex = v0;
		combinedFace.m_indices.push_back(v0);
		v1 = edge->getTargetVertex();
		while (v1 != v0)
		{
			cbtVector3 wa = conv.vertices[prevVertex];
			cbtVector3 wb = conv.vertices[v1];
			cbtVector3 newEdge = wb - wa;
			newEdge.normalize();
			if (numEdges < 2)
				edges[numEdges++] = newEdge;

			//face->addIndex(v1);
			combinedFace.m_indices.push_back(v1);
			edge = edge->getNextEdgeOfFace();
			prevVertex = v1;
			int v01 = edge->getSourceVertex();
			v1 = edge->getTargetVertex();
		}

		cbtAssert(combinedFace.m_indices.size() > 2);

		cbtVector3 faceNormal = edges[0].cross(edges[1]);
		faceNormal.normalize();

		cbtScalar planeEq = 1e30f;

		for (int v = 0; v < combinedFace.m_indices.size(); v++)
		{
			cbtScalar eq = m_polyhedron->m_vertices[combinedFace.m_indices[v]].dot(faceNormal);
			if (planeEq > eq)
			{
				planeEq = eq;
			}
		}
		combinedFace.m_plane[0] = faceNormal.getX();
		combinedFace.m_plane[1] = faceNormal.getY();
		combinedFace.m_plane[2] = faceNormal.getZ();
		combinedFace.m_plane[3] = -planeEq;

		m_polyhedron->m_faces.push_back(combinedFace);
	}

#else  //BT_RECONSTRUCT_FACES

	cbtAlignedObjectArray<cbtVector3> faceNormals;
	int numFaces = conv.faces.size();
	faceNormals.resize(numFaces);
	cbtConvexHullComputer* convexUtil = &conv;

	cbtAlignedObjectArray<cbtFace> tmpFaces;
	tmpFaces.resize(numFaces);

	int numVertices = convexUtil->vertices.size();
	m_polyhedron->m_vertices.resize(numVertices);
	for (int p = 0; p < numVertices; p++)
	{
		m_polyhedron->m_vertices[p] = convexUtil->vertices[p];
	}

	for (int i = 0; i < numFaces; i++)
	{
		int face = convexUtil->faces[i];
		//printf("face=%d\n",face);
		const cbtConvexHullComputer::Edge* firstEdge = &convexUtil->edges[face];
		const cbtConvexHullComputer::Edge* edge = firstEdge;

		cbtVector3 edges[3];
		int numEdges = 0;
		//compute face normals

		do
		{
			int src = edge->getSourceVertex();
			tmpFaces[i].m_indices.push_back(src);
			int targ = edge->getTargetVertex();
			cbtVector3 wa = convexUtil->vertices[src];

			cbtVector3 wb = convexUtil->vertices[targ];
			cbtVector3 newEdge = wb - wa;
			newEdge.normalize();
			if (numEdges < 2)
				edges[numEdges++] = newEdge;

			edge = edge->getNextEdgeOfFace();
		} while (edge != firstEdge);

		cbtScalar planeEq = 1e30f;

		if (numEdges == 2)
		{
			faceNormals[i] = edges[0].cross(edges[1]);
			faceNormals[i].normalize();
			tmpFaces[i].m_plane[0] = faceNormals[i].getX();
			tmpFaces[i].m_plane[1] = faceNormals[i].getY();
			tmpFaces[i].m_plane[2] = faceNormals[i].getZ();
			tmpFaces[i].m_plane[3] = planeEq;
		}
		else
		{
			cbtAssert(0);  //degenerate?
			faceNormals[i].setZero();
		}

		for (int v = 0; v < tmpFaces[i].m_indices.size(); v++)
		{
			cbtScalar eq = m_polyhedron->m_vertices[tmpFaces[i].m_indices[v]].dot(faceNormals[i]);
			if (planeEq > eq)
			{
				planeEq = eq;
			}
		}
		tmpFaces[i].m_plane[3] = -planeEq;
	}

	//merge coplanar faces and copy them to m_polyhedron

	cbtScalar faceWeldThreshold = 0.999f;
	cbtAlignedObjectArray<int> todoFaces;
	for (int i = 0; i < tmpFaces.size(); i++)
		todoFaces.push_back(i);

	while (todoFaces.size())
	{
		cbtAlignedObjectArray<int> coplanarFaceGroup;
		int refFace = todoFaces[todoFaces.size() - 1];

		coplanarFaceGroup.push_back(refFace);
		cbtFace& faceA = tmpFaces[refFace];
		todoFaces.pop_back();

		cbtVector3 faceNormalA(faceA.m_plane[0], faceA.m_plane[1], faceA.m_plane[2]);
		for (int j = todoFaces.size() - 1; j >= 0; j--)
		{
			int i = todoFaces[j];
			cbtFace& faceB = tmpFaces[i];
			cbtVector3 faceNormalB(faceB.m_plane[0], faceB.m_plane[1], faceB.m_plane[2]);
			if (faceNormalA.dot(faceNormalB) > faceWeldThreshold)
			{
				coplanarFaceGroup.push_back(i);
				todoFaces.remove(i);
			}
		}

		bool did_merge = false;
		if (coplanarFaceGroup.size() > 1)
		{
			//do the merge: use Graham Scan 2d convex hull

			cbtAlignedObjectArray<GrahamVector3> orgpoints;
			cbtVector3 averageFaceNormal(0, 0, 0);

			for (int i = 0; i < coplanarFaceGroup.size(); i++)
			{
				//				m_polyhedron->m_faces.push_back(tmpFaces[coplanarFaceGroup[i]]);

				cbtFace& face = tmpFaces[coplanarFaceGroup[i]];
				cbtVector3 faceNormal(face.m_plane[0], face.m_plane[1], face.m_plane[2]);
				averageFaceNormal += faceNormal;
				for (int f = 0; f < face.m_indices.size(); f++)
				{
					int orgIndex = face.m_indices[f];
					cbtVector3 pt = m_polyhedron->m_vertices[orgIndex];

					bool found = false;

					for (int i = 0; i < orgpoints.size(); i++)
					{
						//if ((orgpoints[i].m_orgIndex == orgIndex) || ((rotatedPt-orgpoints[i]).length2()<0.0001))
						if (orgpoints[i].m_orgIndex == orgIndex)
						{
							found = true;
							break;
						}
					}
					if (!found)
						orgpoints.push_back(GrahamVector3(pt, orgIndex));
				}
			}

			cbtFace combinedFace;
			for (int i = 0; i < 4; i++)
				combinedFace.m_plane[i] = tmpFaces[coplanarFaceGroup[0]].m_plane[i];

			cbtAlignedObjectArray<GrahamVector3> hull;

			averageFaceNormal.normalize();
			GrahamScanConvexHull2D(orgpoints, hull, averageFaceNormal);

			for (int i = 0; i < hull.size(); i++)
			{
				combinedFace.m_indices.push_back(hull[i].m_orgIndex);
				for (int k = 0; k < orgpoints.size(); k++)
				{
					if (orgpoints[k].m_orgIndex == hull[i].m_orgIndex)
					{
						orgpoints[k].m_orgIndex = -1;  // invalidate...
						break;
					}
				}
			}

			// are there rejected vertices?
			bool reject_merge = false;

			for (int i = 0; i < orgpoints.size(); i++)
			{
				if (orgpoints[i].m_orgIndex == -1)
					continue;  // this is in the hull...
				// this vertex is rejected -- is anybody else using this vertex?
				for (int j = 0; j < tmpFaces.size(); j++)
				{
					cbtFace& face = tmpFaces[j];
					// is this a face of the current coplanar group?
					bool is_in_current_group = false;
					for (int k = 0; k < coplanarFaceGroup.size(); k++)
					{
						if (coplanarFaceGroup[k] == j)
						{
							is_in_current_group = true;
							break;
						}
					}
					if (is_in_current_group)  // ignore this face...
						continue;
					// does this face use this rejected vertex?
					for (int v = 0; v < face.m_indices.size(); v++)
					{
						if (face.m_indices[v] == orgpoints[i].m_orgIndex)
						{
							// this rejected vertex is used in another face -- reject merge
							reject_merge = true;
							break;
						}
					}
					if (reject_merge)
						break;
				}
				if (reject_merge)
					break;
			}

			if (!reject_merge)
			{
				// do this merge!
				did_merge = true;
				m_polyhedron->m_faces.push_back(combinedFace);
			}
		}
		if (!did_merge)
		{
			for (int i = 0; i < coplanarFaceGroup.size(); i++)
			{
				cbtFace face = tmpFaces[coplanarFaceGroup[i]];
				m_polyhedron->m_faces.push_back(face);
			}
		}
	}

#endif  //BT_RECONSTRUCT_FACES

	m_polyhedron->initialize();

	return true;
}